

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

iterator __thiscall llvm::yaml::Scanner::skip_nb_char(Scanner *this,iterator Position)

{
  char cVar1;
  UTF8Decoded UVar2;
  iterator pcVar3;
  bool bVar4;
  uint uVar5;
  
  if (this->End != Position) {
    cVar1 = *Position;
    if (cVar1 == '\t' || 0xa0 < (byte)(cVar1 + 0x81U)) {
      Position = Position + 1;
    }
    else if (cVar1 < '\0') {
      UVar2 = decodeUTF8(this,Position);
      pcVar3 = (iterator)((ulong)UVar2 >> 0x20);
      uVar5 = UVar2.first;
      if (uVar5 == 0xfeff || pcVar3 == (iterator)0x0) {
        bVar4 = true;
      }
      else {
        bVar4 = (uVar5 - 0x110000 < 0xfff00000 && uVar5 != 0x85) &&
                (uVar5 - 0xfffe < 0xffffe002 && uVar5 - 0xd800 < 0xffff28a0);
        pcVar3 = pcVar3 + (long)Position;
      }
      if (!bVar4) {
        Position = pcVar3;
      }
    }
  }
  return Position;
}

Assistant:

StringRef::iterator Scanner::skip_nb_char(StringRef::iterator Position) {
  if (Position == End)
    return Position;
  // Check 7 bit c-printable - b-char.
  if (   *Position == 0x09
      || (*Position >= 0x20 && *Position <= 0x7E))
    return Position + 1;

  // Check for valid UTF-8.
  if (uint8_t(*Position) & 0x80) {
    UTF8Decoded u8d = decodeUTF8(Position);
    if (   u8d.second != 0
        && u8d.first != 0xFEFF
        && ( u8d.first == 0x85
          || ( u8d.first >= 0xA0
            && u8d.first <= 0xD7FF)
          || ( u8d.first >= 0xE000
            && u8d.first <= 0xFFFD)
          || ( u8d.first >= 0x10000
            && u8d.first <= 0x10FFFF)))
      return Position + u8d.second;
  }
  return Position;
}